

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::VMapEntry::Allocate(VMapEntry *this,uint num)

{
  bool bVar1;
  value_type_conflict6 local_1c;
  uint local_18;
  uint local_14;
  uint m;
  uint num_local;
  VMapEntry *this_local;
  
  local_14 = num;
  _m = this;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(&this->rawData);
  if (bVar1) {
    local_18 = local_14 * this->dims;
    std::vector<float,_std::allocator<float>_>::reserve
              (&this->rawData,(ulong)(local_18 + (local_18 >> 2)));
    local_1c = 0.0;
    std::vector<float,_std::allocator<float>_>::resize(&this->rawData,(ulong)local_18,&local_1c);
    std::vector<bool,_std::allocator<bool>_>::resize(&this->abAssigned,(ulong)local_14,false);
  }
  return;
}

Assistant:

virtual void Allocate(unsigned int num)
    {
        if (!rawData.empty())
            return; // return if already allocated

        const unsigned int m = num*dims;
        rawData.reserve(m + (m>>2u)); // 25% as  extra storage for VMADs
        rawData.resize(m,0.f);
        abAssigned.resize(num,false);
    }